

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# abcRec3.c
# Opt level: O3

int Lms_ObjAreaUnmark_rec(Gia_Obj_t *pObj)

{
  int iVar1;
  ulong uVar2;
  ulong uVar3;
  int iVar4;
  
  uVar2 = *(ulong *)pObj;
  iVar4 = 0;
  if (((uint)uVar2 & 0x9fffffff) != 0x9fffffff && ((uint)uVar2 >> 0x1e & 1) != 0) {
    iVar4 = 0;
    do {
      *(ulong *)pObj = uVar2 & 0xffffffffbfffffff;
      iVar1 = Lms_ObjAreaUnmark_rec(pObj + -(uVar2 & 0x1fffffff));
      uVar3 = (ulong)*(uint *)&pObj->field_0x4 & 0x1fffffff;
      iVar4 = iVar4 + iVar1 + 1;
      uVar2 = *(ulong *)(pObj + -uVar3);
      if (((uint)uVar2 >> 0x1e & 1) == 0) {
        return iVar4;
      }
      pObj = pObj + -uVar3;
    } while (((uint)uVar2 & 0x9fffffff) != 0x9fffffff);
  }
  return iVar4;
}

Assistant:

int  Lms_ObjAreaUnmark_rec( Gia_Obj_t * pObj )
{
    if ( !pObj->fMark0 || Gia_ObjIsCi(pObj) )
        return 0;
    pObj->fMark0 = 0;
    return 1 + Lms_ObjAreaUnmark_rec( Gia_ObjFanin0(pObj) ) 
             + Lms_ObjAreaUnmark_rec( Gia_ObjFanin1(pObj) );
}